

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
ConstantTable&,soul::StringDictionary&)::ConversionState::convert(soul::Type_const&,choc::value::
ValueView_const__(Value *__return_storage_ptr__,void *this,Type *targetType,ValueView *source)

{
  MainType MVar1;
  ConstantTable *this_00;
  long *plVar2;
  double v;
  bool bVar3;
  bool bVar4;
  int32_t v_00;
  uint32_t uVar5;
  Handle h;
  Handle h_00;
  Structure *pSVar6;
  Member *targetType_00;
  ArraySize AVar7;
  int64_t v_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  ValueView *pVVar9;
  size_t index;
  StructurePtr *this_01;
  uint uVar10;
  ulong uVar11;
  float v_02;
  Value result;
  Type elementType;
  Type elementType_1;
  PrimitiveType elementType_2;
  Value local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  Type local_278;
  Structure *local_260;
  ValueView *local_258;
  undefined1 local_250 [8];
  undefined1 local_248 [56];
  ArrayWithPreallocation<unsigned_long,_4UL> local_210;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *local_1d8;
  PrimitiveType local_1d0;
  undefined1 local_1cc [4];
  ValueView local_1c8;
  Type local_198;
  Type local_180;
  Type local_168;
  Value local_150;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  MVar1 = (source->type).mainType;
  if (MVar1 == boolean) {
    bVar4 = choc::value::ValueView::getBool(source);
    Value::Value(&local_2c0,bVar4);
    castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
  }
  else {
    if (MVar1 == object) {
      pVVar9 = source;
      if (targetType->category == structure) {
        pSVar6 = Type::getStructRef(targetType);
        uVar5 = choc::value::Type::getNumElements(&source->type);
        local_258 = (ValueView *)CONCAT44(local_258._4_4_,uVar5);
        local_260 = pSVar6;
        if ((pSVar6->members).numActive == (ulong)uVar5) {
          Type::Type(&local_180,targetType);
          zeroInitialiser(__return_storage_ptr__,&local_180);
          local_1d8 = &local_260->members;
          RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_180.structure);
          uVar10 = 0;
          do {
            uVar11 = (ulong)uVar10;
            if ((local_260->members).numActive <= uVar11) {
              return __return_storage_ptr__;
            }
            targetType_00 =
                 ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[](local_1d8,uVar11);
            local_280 = &targetType_00->name;
            bVar4 = false;
            uVar5 = 0;
            do {
              if ((uint32_t)local_258 == uVar5) break;
              choc::value::ValueView::getObjectMemberAt
                        ((MemberNameAndValue *)local_250,source,uVar5);
              bVar3 = std::operator==(local_280,(char *)local_250);
              if (bVar3) {
                SubElementPath::SubElementPath((SubElementPath *)&local_210,uVar11);
                pVVar9 = (ValueView *)local_248;
                ValueView_const__(&local_2c0,this,&targetType_00->type,pVVar9);
                modifySubElementInPlace
                          (__return_storage_ptr__,(SubElementPath *)&local_210,&local_2c0);
                ~Value(&local_2c0);
                ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_210);
                bVar4 = true;
              }
              choc::value::Type::deleteAllocatedObjects((Type *)local_248);
              uVar5 = uVar5 + 1;
            } while (!bVar3);
            uVar10 = uVar10 + 1;
            if (!bVar4) {
              Errors::unknownMemberInStruct<std::__cxx11::string&,std::__cxx11::string_const&>
                        (&local_d8,(Errors *)local_280,&local_260->name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar9
                        );
              throwError(&local_d8);
            }
          } while( true );
        }
      }
      local_1c8.type._0_16_ = choc::value::Type::getObjectClassName(&source->type);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_250,(basic_string_view<char,_std::char_traits<char>_> *)&local_1c8,
                 (allocator<char> *)&local_278);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c0
                     ,"struct ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250)
      ;
      Type::getDescription_abi_cxx11_((string *)&local_210,targetType);
      Errors::cannotCastBetween<std::__cxx11::string,std::__cxx11::string>
                (&local_110,(Errors *)&local_2c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar9);
      throwError(&local_110);
    }
    if (MVar1 == int64) {
      v_01 = choc::value::ValueView::getInt64(source);
      Value::Value(&local_2c0,v_01);
      castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
    }
    else if (MVar1 == float32) {
      v_02 = choc::value::ValueView::getFloat32(source);
      Value::Value(&local_2c0,v_02);
      castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
    }
    else if (MVar1 == float64) {
      v = choc::value::ValueView::getFloat64(source);
      Value::Value(&local_2c0,v);
      castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
    }
    else {
      if (MVar1 == string) {
        plVar2 = *(long **)((long)this + 8);
        local_210._0_16_ = choc::value::ValueView::getString(source);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_250,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_210,
                   (allocator<char> *)&local_1c8);
        h.handle = (**(code **)(*plVar2 + 0x10))(plVar2,local_248._0_8_,local_250);
        createStringLiteral(&local_2c0,h);
        castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
        ~Value(&local_2c0);
        std::__cxx11::string::~string((string *)local_250);
        return __return_storage_ptr__;
      }
      if (MVar1 == vector) {
        pVVar9 = source;
        uVar5 = choc::value::Type::getNumElements(&source->type);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71((int7)((ulong)pVVar9 >> 8),uVar5 == 1);
        if (targetType->category == primitive && uVar5 == 1) {
          choc::value::ValueView::operator[]((ValueView *)&local_2c0,source,0);
          ValueView_const__(__return_storage_ptr__,this,targetType,(ValueView *)&local_2c0);
          choc::value::Type::deleteAllocatedObjects((Type *)&local_2c0);
          return __return_storage_ptr__;
        }
        local_258 = source;
        if (targetType->category != vector) {
          Type::getDescription_abi_cxx11_((string *)&local_2c0,targetType);
          Errors::cannotCastBetween<char_const(&)[7],std::__cxx11::string>
                    (&local_68,(Errors *)0x275577,(char (*) [7])&local_2c0,pbVar8);
          throwError(&local_68);
        }
        Type::getVectorElementType((Type *)local_1cc);
        local_1d0.type = (Primitive)local_1cc;
        local_280 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (ulong)uVar5;
        Type::createVector(&local_168,&local_1d0,(ArraySize)local_280);
        zeroInitialiser(&local_2c0,&local_168);
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_168.structure);
        for (pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_280 != pbVar8;
            pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar8->_M_dataplus)._M_p + 1)) {
          SubElementPath::SubElementPath((SubElementPath *)&local_210,(size_t)pbVar8);
          local_278.arrayElementCategory = invalid;
          local_278.isRef = false;
          local_278.isConstant = false;
          local_278.primitiveType.type = (Primitive)local_1cc;
          local_278.boundingSize = 0;
          local_278.arrayElementBoundingSize = 0;
          local_278.structure.object = (Structure *)0x0;
          local_278.category = local_1cc != (undefined1  [4])0x0;
          choc::value::ValueView::operator[](&local_1c8,local_258,(uint32_t)pbVar8);
          ValueView_const__((Value *)local_250,this,&local_278,&local_1c8);
          modifySubElementInPlace(&local_2c0,(SubElementPath *)&local_210,(Value *)local_250);
          ~Value((Value *)local_250);
          choc::value::Type::deleteAllocatedObjects(&local_1c8.type);
          RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_278.structure);
          ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_210);
        }
        castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
      }
      else {
        if ((MVar1 == primitiveArray) || (MVar1 == complexArray)) {
          pVVar9 = source;
          uVar5 = choc::value::Type::getNumElements(&source->type);
          uVar11 = (ulong)uVar5;
          if ((targetType->category == array) && (targetType->boundingSize == 0)) {
            Type::getElementType((Type *)local_250,targetType);
            Type::createArray((Type *)&local_210,(Type *)local_250,uVar11);
            ValueView_const__(&local_2c0,this,(Type *)&local_210,source);
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)((long)&local_210 + 0x10));
            this_00 = *this;
            Value::Value(&local_150,&local_2c0);
            h_00 = ConstantTable::getHandleForValue(this_00,&local_150);
            createUnsizedArray(__return_storage_ptr__,(Type *)local_250,h_00);
            ~Value(&local_150);
            ~Value(&local_2c0);
            this_01 = (StructurePtr *)(local_248 + 8);
          }
          else {
            if ((targetType->category != array) ||
               (AVar7 = Type::getArraySize(targetType), AVar7 != uVar11)) {
              std::__cxx11::to_string((string *)&local_210,uVar5);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_250,"array[",(string *)&local_210);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_2c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_250,"]");
              Type::getDescription_abi_cxx11_((string *)&local_1c8,targetType);
              Errors::cannotCastBetween<std::__cxx11::string,std::__cxx11::string>
                        (&local_a0,(Errors *)&local_2c0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pVVar9
                        );
              throwError(&local_a0);
            }
            Type::getArrayElementType(&local_278,targetType);
            Type::createArray(&local_198,&local_278,uVar11);
            zeroInitialiser(&local_2c0,&local_198);
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_198.structure);
            for (index = 0; uVar11 != index; index = index + 1) {
              SubElementPath::SubElementPath((SubElementPath *)&local_210,index);
              choc::value::ValueView::operator[](&local_1c8,source,(uint32_t)index);
              ValueView_const__((Value *)local_250,this,&local_278,&local_1c8);
              modifySubElementInPlace(&local_2c0,(SubElementPath *)&local_210,(Value *)local_250);
              ~Value((Value *)local_250);
              choc::value::Type::deleteAllocatedObjects(&local_1c8.type);
              ArrayWithPreallocation<unsigned_long,_4UL>::clear(&local_210);
            }
            castOrThrow(soul::Type_const&,soul::Value___
                      (__return_storage_ptr__,targetType,&local_2c0);
            ~Value(&local_2c0);
            this_01 = &local_278.structure;
          }
          RefCountedPtr<soul::Structure>::~RefCountedPtr(this_01);
          return __return_storage_ptr__;
        }
        if (MVar1 != int32) {
          (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
          (__return_storage_ptr__->allocatedData).allocatedSize = 0;
          (__return_storage_ptr__->type).category = invalid;
          (__return_storage_ptr__->type).arrayElementCategory = invalid;
          (__return_storage_ptr__->type).isRef = false;
          (__return_storage_ptr__->type).isConstant = false;
          (__return_storage_ptr__->type).primitiveType = invalid;
          (__return_storage_ptr__->type).boundingSize = 0;
          (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
          (__return_storage_ptr__->allocatedData).allocatedData.items =
               (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
          (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
          (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
          return __return_storage_ptr__;
        }
        v_00 = choc::value::ValueView::getInt32(source);
        Value::Value(&local_2c0,v_00);
        castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,targetType,&local_2c0);
      }
    }
  }
  ~Value(&local_2c0);
  return __return_storage_ptr__;
}

Assistant:

Value convert (const Type& targetType, const choc::value::ValueView& source)
        {
            if (source.isInt32())    return castOrThrow (targetType, Value::createInt32 (source.getInt32()));
            if (source.isInt64())    return castOrThrow (targetType, Value::createInt64 (source.getInt64()));
            if (source.isFloat32())  return castOrThrow (targetType, Value (source.getFloat32()));
            if (source.isFloat64())  return castOrThrow (targetType, Value (source.getFloat64()));
            if (source.isBool())     return castOrThrow (targetType, Value (source.getBool()));
            if (source.isString())   return castOrThrow (targetType, Value::createStringLiteral (dictionary.getHandleForString (std::string (source.getString()))));

            if (source.isVector())
            {
                auto size = source.size();

                if (size == 1 && targetType.isPrimitive())
                    return convert (targetType, source[0]);

                if (! targetType.isVector())
                    throwError (Errors::cannotCastBetween ("vector", targetType.getDescription()));

                auto elementType = targetType.getVectorElementType();
                auto result = Value::zeroInitialiser (Type::createVector (elementType, size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isArray())
            {
                auto size = source.size();

                if (targetType.isUnsizedArray())
                {
                    auto elementType = targetType.getElementType();
                    auto fixedArray = convert (elementType.createArray (size), source);
                    return Value::createUnsizedArray (elementType, constants.getHandleForValue (std::move (fixedArray)));
                }

                if (! (targetType.isArray() && size == targetType.getArraySize()))
                    throwError (Errors::cannotCastBetween ("array[" + std::to_string (size) + "]", targetType.getDescription()));

                auto elementType = targetType.getArrayElementType();
                auto result = Value::zeroInitialiser (elementType.createArray (size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isObject())
            {
                if (targetType.isStruct())
                {
                    auto& targetStruct = targetType.getStructRef();
                    auto numMembers = source.size();

                    if (targetStruct.getMembers().size() == numMembers)
                    {
                        auto result = Value::zeroInitialiser (targetType);

                        for (uint32_t j = 0; j < targetStruct.getMembers().size(); ++j)
                        {
                            auto& m = targetStruct.getMembers()[j];
                            bool found = false;

                            for (uint32_t i = 0; i < numMembers; ++i)
                            {
                                auto sourceMember = source.getObjectMemberAt (i);

                                if (m.name == sourceMember.name)
                                {
                                    result.modifySubElementInPlace (j, convert (m.type, sourceMember.value));
                                    found = true;
                                    break;
                                }
                            }

                            if (! found)
                                throwError (Errors::unknownMemberInStruct (m.name, targetStruct.getName()));
                        }

                        return result;
                    }
                }

                throwError (Errors::cannotCastBetween ("struct " + std::string (source.getObjectClassName()),
                                                       targetType.getDescription()));
            }

            return {};
        }